

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TiledInputFile::setFrameBuffer(TiledInputFile *this,FrameBuffer *frameBuffer)

{
  undefined8 *puVar1;
  Data *pDVar2;
  pointer pTVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  double dVar7;
  undefined6 uVar8;
  PixelType PVar9;
  PixelType PVar10;
  pointer pTVar11;
  int iVar12;
  TInSliceInfo *__cur;
  ChannelList *this_00;
  const_iterator cVar13;
  ConstIterator CVar14;
  ConstIterator CVar15;
  const_iterator cVar16;
  pointer pTVar17;
  long lVar18;
  pointer pTVar19;
  ostream *poVar20;
  char *pcVar21;
  ArgExc *this_01;
  size_t __n;
  ulong __n_00;
  bool bVar22;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  slices;
  Lock local_1c8;
  stringstream _iex_throw_s;
  ostream oStack_1a8;
  undefined7 uStack_1a7;
  undefined1 uStack_1a0;
  undefined7 uStack_19f;
  bool bStack_198;
  bool local_197;
  _Base_ptr local_190;
  ulong uStack_188;
  
  local_1c8._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_1c8._mutex);
  local_1c8._locked = true;
  this_00 = Header::channels(&this->_data->header);
  cVar13._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  while( true ) {
    CVar14 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar13._M_node == CVar14._i._M_node) break;
    CVar15 = ChannelList::find(this_00,(char *)(cVar13._M_node + 1));
    cVar16._M_node = (_Base_ptr)ChannelList::end(this_00);
    if ((CVar15._i._M_node != (const_iterator)cVar16._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar15._i._M_node + 0x124) != cVar13._M_node[10]._M_color ||
        (*(int *)((long)CVar15._i._M_node + 0x128) != *(int *)&cVar13._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar20 = std::operator<<(&oStack_1a8,"X and/or y subsampling factors of \"");
      poVar20 = std::operator<<(poVar20,(char *)((long)CVar15._i._M_node + 0x20));
      poVar20 = std::operator<<(poVar20,"\" channel of input file \"");
      pcVar21 = fileName(this);
      poVar20 = std::operator<<(poVar20,pcVar21);
      std::operator<<(poVar20,"\" are not compatible with the frame buffer\'s subsampling factors.")
      ;
      this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this_01,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
  }
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  slices.
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar16._M_node = (_Base_ptr)ChannelList::begin(this_00);
  cVar13._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  do {
    CVar14 = FrameBuffer::end(frameBuffer);
    if ((const_iterator)cVar13._M_node == CVar14._i._M_node) {
      while( true ) {
        CVar15 = ChannelList::end(this_00);
        if ((const_iterator)cVar16._M_node == CVar15._i._M_node) break;
        __iex_throw_s = cVar16._M_node[9]._M_color;
        uStack_1a0 = 0;
        uStack_19f = 0;
        bStack_198 = false;
        oStack_1a8 = (ostream)0x0;
        uStack_1a7 = 0;
        local_197 = true;
        local_190 = (_Base_ptr)0x0;
        uStack_188 = 0;
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ::push_back(&slices,(value_type *)&_iex_throw_s);
        cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&this->_data->frameBuffer,
                  (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)frameBuffer);
      pTVar11 = slices.
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pTVar3 = slices.
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar2 = this->_data;
      __n_00 = (long)slices.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)slices.
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar17 = (pDVar2->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar2->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar17) < __n_00
         ) {
        pTVar17 = std::
                  _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                  ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                 *)((long)__n_00 / 0x38),(size_t)frameBuffer);
        for (lVar18 = 0; pTVar19 = (pointer)((long)&pTVar3->typeInFrameBuffer + lVar18),
            pTVar19 != pTVar11; lVar18 = lVar18 + 0x38) {
          puVar1 = (undefined8 *)((long)&pTVar17->typeInFrameBuffer + lVar18);
          puVar1[6] = *(undefined8 *)&pTVar19->xTileCoords;
          uVar4 = *(undefined8 *)pTVar19;
          pcVar21 = pTVar19->base;
          sVar5 = pTVar19->xStride;
          sVar6 = pTVar19->yStride;
          dVar7 = pTVar19->fillValue;
          puVar1[4] = *(undefined8 *)&pTVar19->fill;
          puVar1[5] = dVar7;
          puVar1[2] = sVar5;
          puVar1[3] = sVar6;
          *puVar1 = uVar4;
          puVar1[1] = pcVar21;
        }
        pTVar3 = (pDVar2->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar18 = (long)(pDVar2->slices).
                       super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar3;
        std::
        _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ::_M_deallocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                         *)pTVar3,(pointer)(lVar18 / 0x38),lVar18 % 0x38);
        (pDVar2->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pTVar17;
        (pDVar2->slices).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pTVar17 + __n_00);
      }
      else {
        pTVar19 = (pDVar2->slices).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)pTVar19 - (long)pTVar17;
        if (__n < __n_00) {
          if (pTVar19 != pTVar17) {
            memmove(pTVar17,slices.
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,__n);
            pTVar19 = (pDVar2->slices).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            __n = (long)pTVar19 -
                  (long)(pDVar2->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          }
          for (pTVar17 = (pointer)((long)&pTVar3->typeInFrameBuffer + __n); pTVar17 != pTVar11;
              pTVar17 = pTVar17 + 1) {
            iVar12 = pTVar17->yTileCoords;
            pTVar19->xTileCoords = pTVar17->xTileCoords;
            pTVar19->yTileCoords = iVar12;
            PVar9 = pTVar17->typeInFrameBuffer;
            PVar10 = pTVar17->typeInFile;
            pcVar21 = pTVar17->base;
            sVar5 = pTVar17->xStride;
            sVar6 = pTVar17->yStride;
            bVar22 = pTVar17->skip;
            uVar8 = *(undefined6 *)&pTVar17->field_0x22;
            dVar7 = pTVar17->fillValue;
            pTVar19->fill = pTVar17->fill;
            pTVar19->skip = bVar22;
            *(undefined6 *)&pTVar19->field_0x22 = uVar8;
            pTVar19->fillValue = dVar7;
            pTVar19->xStride = sVar5;
            pTVar19->yStride = sVar6;
            pTVar19->typeInFrameBuffer = PVar9;
            pTVar19->typeInFile = PVar10;
            pTVar19->base = pcVar21;
            pTVar19 = pTVar19 + 1;
          }
        }
        else if (slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 slices.
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          memmove(pTVar17,slices.
                          super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,__n_00);
        }
      }
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(__n_00 + (long)(pDVar2->slices).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::~vector(&slices);
      IlmThread_2_5::Lock::~Lock(&local_1c8);
      return;
    }
    while( true ) {
      CVar15 = ChannelList::end(this_00);
      if ((const_iterator)cVar16._M_node == CVar15._i._M_node) break;
      iVar12 = strcmp((char *)(cVar16._M_node + 1),(char *)(cVar13._M_node + 1));
      if (-1 < iVar12) break;
      __iex_throw_s = cVar16._M_node[9]._M_color;
      uStack_1a0 = 0;
      uStack_19f = 0;
      bStack_198 = false;
      oStack_1a8 = (ostream)0x0;
      uStack_1a7 = 0;
      local_197 = true;
      local_190 = (_Base_ptr)0x0;
      uStack_188 = 0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ::push_back(&slices,(value_type *)&_iex_throw_s);
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
    }
    CVar15 = ChannelList::end(this_00);
    if ((const_iterator)cVar16._M_node == CVar15._i._M_node) {
LAB_0046027d:
      bVar22 = true;
    }
    else {
      iVar12 = strcmp((char *)(cVar16._M_node + 1),(char *)(cVar13._M_node + 1));
      if (0 < iVar12) goto LAB_0046027d;
      bVar22 = false;
    }
    __iex_throw_s = cVar13._M_node[9]._M_color;
    local_190 = cVar13._M_node[10]._M_parent;
    oStack_1a8 = SUB81(cVar13._M_node[9]._M_left,0);
    uStack_1a7 = (undefined7)((ulong)cVar13._M_node[9]._M_left >> 8);
    uStack_1a0 = SUB81(cVar13._M_node[9]._M_right,0);
    uStack_19f = (undefined7)((ulong)cVar13._M_node[9]._M_right >> 8);
    local_197 = false;
    uStack_188 = (ulong)CONCAT14(*(undefined1 *)((long)&cVar13._M_node[10]._M_left + 1),
                                 (uint)*(byte *)&cVar13._M_node[10]._M_left);
    bStack_198 = bVar22;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
    ::push_back(&slices,(value_type *)&_iex_throw_s);
    CVar15 = ChannelList::end(this_00);
    if (bVar22 == false && (const_iterator)cVar16._M_node != CVar15._i._M_node) {
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
    }
    cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
  } while( true );
}

Assistant:

void	
TiledInputFile::setFrameBuffer (const FrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
				"of \"" << i.name() << "\" channel "
				"of input file \"" << fileName() << "\" are "
				"not compatible with the frame buffer's "
				"subsampling factors.");
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (TInSliceInfo (i.channel().type,
					    i.channel().type,
					    0,      // base
					    0,      // xStride
					    0,      // yStride
					    false,  // fill
					    true,   // skip
					    0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (TInSliceInfo (j.slice().type,
                                        fill? j.slice().type: i.channel().type,
                                        j.slice().base,
                                        j.slice().xStride,
                                        j.slice().yStride,
                                        fill,
                                        false, // skip
                                        j.slice().fillValue,
                                        (j.slice().xTileCoords)? 1: 0,
                                        (j.slice().yTileCoords)? 1: 0));

        if (i != channels.end() && !fill)
            ++i;
    }

    while (i != channels.end())
    {
	//
	// Channel i is present in the file but not
	// in the frame buffer; data for channel i
	// will be skipped during readPixels().
	//

	slices.push_back (TInSliceInfo (i.channel().type,
					i.channel().type,
					0, // base
					0, // xStride
					0, // yStride
					false,  // fill
					true, // skip
					0.0)); // fillValue
	++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;
    _data->slices = slices;
}